

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O0

double __thiscall SharedMatting::nP(SharedMatting *this,int i,int j,Scalar *f,Scalar *b)

{
  int j_00;
  int i_00;
  int *piVar1;
  Scalar_<double> local_b0;
  Scalar_<double> local_90;
  double local_70;
  double m;
  int l;
  int k;
  double result;
  int local_50;
  int local_4c;
  int j2;
  int local_44;
  int local_40;
  int j1;
  int local_38;
  int local_34;
  int i2;
  int local_2c;
  Scalar *pSStack_28;
  int i1;
  Scalar *b_local;
  Scalar *f_local;
  int j_local;
  int i_local;
  SharedMatting *this_local;
  
  i2 = 0;
  local_34 = i + -1;
  pSStack_28 = b;
  b_local = f;
  f_local._0_4_ = j;
  f_local._4_4_ = i;
  _j_local = this;
  piVar1 = std::max<int>(&i2,&local_34);
  local_2c = *piVar1;
  j1 = f_local._4_4_ + 1;
  local_40 = this->height + -1;
  piVar1 = std::min<int>(&j1,&local_40);
  local_38 = *piVar1;
  j2 = 0;
  local_4c = (int)f_local + -1;
  piVar1 = std::max<int>(&j2,&local_4c);
  local_44 = *piVar1;
  result._4_4_ = (int)f_local + 1;
  result._0_4_ = this->width + -1;
  piVar1 = std::min<int>((int *)((long)&result + 4),(int *)&result);
  local_50 = *piVar1;
  _l = 0.0;
  for (m._4_4_ = local_2c; m._4_4_ <= local_38; m._4_4_ = m._4_4_ + 1) {
    for (m._0_4_ = local_44; i_00 = m._4_4_, j_00 = m._0_4_, m._0_4_ <= local_50;
        m._0_4_ = m._0_4_ + 1) {
      cv::Scalar_<double>::Scalar_(&local_90,f);
      cv::Scalar_<double>::Scalar_(&local_b0,b);
      local_70 = mP(this,i_00,j_00,&local_90,&local_b0);
      _l = local_70 * local_70 + _l;
    }
  }
  return _l;
}

Assistant:

double SharedMatting::nP(int i, int j, Scalar f, Scalar b)
{
    int i1 = max(0, i - 1);
    int i2 = min(i + 1, height - 1);
    int j1 = max(0, j - 1);
    int j2 = min(j + 1, width - 1);

    double  result = 0;

    for (int k = i1; k <= i2; ++k)
    {
        for (int l = j1; l <= j2; ++l)
        {
            double m = mP(k, l, f, b);
            result += m * m;
        }
    }

    return result;
}